

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

int BZ2_bzCompressEnd(bz_stream *strm)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = -2;
  if (((strm != (bz_stream *)0x0) &&
      (plVar1 = (long *)strm->state, iVar2 = -2, plVar1 != (long *)0x0)) &&
     ((bz_stream *)*plVar1 == strm)) {
    if ((void *)plVar1[3] != (void *)0x0) {
      (*strm->bzfree)(strm->opaque,(void *)plVar1[3]);
    }
    if ((void *)plVar1[4] != (void *)0x0) {
      (*strm->bzfree)(strm->opaque,(void *)plVar1[4]);
    }
    if ((void *)plVar1[5] != (void *)0x0) {
      (*strm->bzfree)(strm->opaque,(void *)plVar1[5]);
    }
    (*strm->bzfree)(strm->opaque,strm->state);
    strm->state = (void *)0x0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int BZ_API(BZ2_bzCompressEnd)  ( bz_stream *strm )
{
   EState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   if (s->arr1 != NULL) BZFREE(s->arr1);
   if (s->arr2 != NULL) BZFREE(s->arr2);
   if (s->ftab != NULL) BZFREE(s->ftab);
   BZFREE(strm->state);

   strm->state = NULL;   

   return BZ_OK;
}